

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

ostream * mjs::operator<<(ostream *os,token *t)

{
  ostream *poVar1;
  __string_type s;
  wostringstream oss;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  long *local_1b0;
  long local_1a8;
  long local_1a0 [2];
  wostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::wostringstream::wostringstream(local_190);
  operator<<((wostream *)local_190,t);
  std::__cxx11::wstringbuf::str();
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
            ((string *)&local_1d0,local_1b0,(long)local_1b0 + local_1a8 * 4);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_1d0,local_1c8);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] * 4 + 4);
  }
  std::__cxx11::wostringstream::~wostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const token& t) {
    std::wostringstream oss;
    oss << t;
    auto s = oss.str();
    return os << std::string{s.begin(),s.end()};
}